

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  JSAtom atom;
  char *str;
  ulong uVar4;
  JSValue JVar5;
  JSValue val;
  
  if ((int)this_val.tag == 3) {
    str = "Undefined";
  }
  else {
    if ((int)this_val.tag != 2) {
      val = JS_ToObject(ctx,this_val);
      if ((int)val.tag == 6) {
        return val;
      }
      iVar3 = JS_IsArray(ctx,val);
      if (iVar3 < 0) {
        JS_FreeValue(ctx,val);
        uVar4 = 6;
LAB_00152c02:
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        return (JSValue)(auVar2 << 0x40);
      }
      atom = 0x90;
      if (iVar3 == 0) {
        iVar3 = JS_IsFunction(ctx,val);
        atom = 0x9a;
        if (iVar3 == 0) {
          uVar1 = *(ushort *)((long)val.u.ptr + 6);
          atom = 0x8f;
          if ((uVar1 < 0x13) && ((0x40778U >> (uVar1 & 0x1f) & 1) != 0)) {
            atom = ctx->rt->class_array[uVar1].class_name;
          }
        }
      }
      JVar5 = JS_GetPropertyInternal(ctx,val,0xcc,val,0);
      JS_FreeValue(ctx,val);
      if ((int)JVar5.tag != -7) {
        if ((int)JVar5.tag == 6) {
          uVar4 = JVar5.tag & 0xffffffff;
          goto LAB_00152c02;
        }
        JS_FreeValue(ctx,JVar5);
        JVar5 = JS_AtomToString(ctx,atom);
      }
      goto LAB_00152b02;
    }
    str = "Null";
  }
  JVar5 = JS_NewString(ctx,str);
LAB_00152b02:
  JVar5 = JS_ConcatString3(ctx,"[object ",JVar5,"]");
  return JVar5;
}

Assistant:

static JSValue js_object_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue obj, tag;
    int is_array;
    JSAtom atom;
    JSObject *p;

    if (JS_IsNull(this_val)) {
        tag = JS_NewString(ctx, "Null");
    } else if (JS_IsUndefined(this_val)) {
        tag = JS_NewString(ctx, "Undefined");
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (JS_IsException(obj))
            return obj;
        is_array = JS_IsArray(ctx, obj);
        if (is_array < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
        if (is_array) {
            atom = JS_ATOM_Array;
        } else if (JS_IsFunction(ctx, obj)) {
            atom = JS_ATOM_Function;
        } else {
            p = JS_VALUE_GET_OBJ(obj);
            switch(p->class_id) {
            case JS_CLASS_STRING:
            case JS_CLASS_ARGUMENTS:
            case JS_CLASS_MAPPED_ARGUMENTS:
            case JS_CLASS_ERROR:
            case JS_CLASS_BOOLEAN:
            case JS_CLASS_NUMBER:
            case JS_CLASS_DATE:
            case JS_CLASS_REGEXP:
                atom = ctx->rt->class_array[p->class_id].class_name;
                break;
            default:
                atom = JS_ATOM_Object;
                break;
            }
        }
        tag = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_toStringTag);
        JS_FreeValue(ctx, obj);
        if (JS_IsException(tag))
            return JS_EXCEPTION;
        if (!JS_IsString(tag)) {
            JS_FreeValue(ctx, tag);
            tag = JS_AtomToString(ctx, atom);
        }
    }
    return JS_ConcatString3(ctx, "[object ", tag, "]");
}